

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O2

Matrix * __thiscall CSR::turnToRegular(CSR *this)

{
  int iVar1;
  int col;
  int *piVar2;
  double *pdVar3;
  int *piVar4;
  Matrix *this_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  allocator local_41;
  string local_40;
  
  this_00 = (Matrix *)operator_new(0x30);
  iVar1 = this->row;
  col = this->col;
  std::__cxx11::string::string((string *)&local_40,"turn to regular:",&local_41);
  Matrix::Matrix(this_00,iVar1,col,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  piVar2 = this->ptr;
  uVar6 = 0;
  uVar5 = (ulong)(uint)this->row;
  if (this->row < 1) {
    uVar5 = uVar6;
  }
  while (uVar7 = uVar6, uVar7 != uVar5) {
    iVar1 = piVar2[uVar7 + 1];
    pdVar3 = this->val;
    piVar4 = this->idx;
    for (lVar8 = (long)piVar2[uVar7]; uVar6 = uVar7 + 1, lVar8 < iVar1; lVar8 = lVar8 + 1) {
      this_00->array[uVar7][piVar4[lVar8]] = pdVar3[lVar8];
    }
  }
  return this_00;
}

Assistant:

Matrix* CSR::turnToRegular()
{

    Matrix *y = new Matrix(row, col, "turn to regular:");

    for (int i = 0; i < row; i++)
    {
        for (int j = ptr[i]; j < ptr[i + 1]; j++)
        {

            y->array[i][idx[j]] = val[j];

        }
    }
    return y;
}